

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTest.cxx
# Opt level: O0

void __thiscall cmTest::cmTest(cmTest *this,cmMakefile *mf)

{
  PolicyStatus PVar1;
  cmMakefile *mf_local;
  cmTest *this_local;
  
  cmPropertyMap::cmPropertyMap(&this->Properties);
  std::__cxx11::string::string((string *)&this->Name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Command);
  this->CommandExpandLists = false;
  cmMakefile::GetBacktrace((cmMakefile *)&this->Backtrace);
  PVar1 = cmMakefile::GetPolicyStatus(mf,CMP0158,false);
  this->PolicyStatusCMP0158 = PVar1;
  this->Makefile = mf;
  this->OldStyle = true;
  return;
}

Assistant:

cmTest::cmTest(cmMakefile* mf)
  : Backtrace(mf->GetBacktrace())
  , PolicyStatusCMP0158(mf->GetPolicyStatus(cmPolicies::CMP0158))
{
  this->Makefile = mf;
  this->OldStyle = true;
}